

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O0

bool density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::try_pin_page
               (progress_guarantee i_progress_guarantee,void *i_address)

{
  memory_order mVar1;
  PageAllocator<density::detail::SystemPageManager<65536UL>_> *this;
  atomic<unsigned_long> *paVar2;
  __int_type _Var3;
  __int_type *p_Var4;
  __int_type local_b8;
  __int_type curr_value;
  PageFooter *footer;
  void *i_address_local;
  progress_guarantee i_progress_guarantee_local;
  __int_type local_70;
  memory_order local_68;
  int local_64;
  memory_order __b;
  undefined4 local_54;
  __int_type local_50;
  __int_type *local_48;
  __int_type *local_40;
  bool local_31;
  
  footer = (PageFooter *)i_address;
  i_address_local._0_4_ = i_progress_guarantee;
  this = (PageAllocator<density::detail::SystemPageManager<65536UL>_> *)
         PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance();
  process_pending_unpins(this,(progress_guarantee)i_address_local);
  curr_value = (__int_type)get_footer(footer);
  if ((int)(progress_guarantee)i_address_local < 3) {
    LOCK();
    (((PageFooter *)curr_value)->m_pin_count).super___atomic_base<unsigned_long>._M_i =
         (((PageFooter *)curr_value)->m_pin_count).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    i_address_local._7_1_ = true;
  }
  else {
    paVar2 = &((PageFooter *)curr_value)->m_pin_count;
    local_64 = 5;
    ___b = paVar2;
    local_68 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_64 - 1U < 2) {
      local_70 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_64 == 5) {
      local_70 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_70 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    local_b8 = local_70;
    p_Var4 = (__int_type *)(curr_value + 8);
    _Var3 = local_70 + 1;
    local_48 = &local_b8;
    local_54 = 5;
    local_50 = _Var3;
    local_40 = p_Var4;
    mVar1 = std::__cmpexch_failure_order(memory_order_seq_cst);
    switch(0x2093fa0) {
    default:
      if (mVar1 - memory_order_consume < 2) {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      else if (mVar1 == memory_order_seq_cst) {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      else {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      break;
    case 2:
      if (mVar1 - memory_order_consume < 2) {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      else if (mVar1 == memory_order_seq_cst) {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      else {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      break;
    case 3:
      if (mVar1 - memory_order_consume < 2) {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      else if (mVar1 == memory_order_seq_cst) {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      else {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      break;
    case 4:
      if (mVar1 - memory_order_consume < 2) {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      else if (mVar1 == memory_order_seq_cst) {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
      else {
        LOCK();
        local_31 = local_b8 == *p_Var4;
        if (local_31) {
          *p_Var4 = _Var3;
        }
        UNLOCK();
      }
    }
    i_address_local._7_1_ = local_31;
  }
  return i_address_local._7_1_;
}

Assistant:

static bool
              try_pin_page(progress_guarantee i_progress_guarantee, void * const i_address) noexcept
            {
                t_instance.process_pending_unpins(i_progress_guarantee);

                auto const footer = get_footer(i_address);
                if (i_progress_guarantee <= progress_guarantee::progress_lock_free)
                {
                    footer->m_pin_count.fetch_add(1, detail::mem_relaxed);
                    return true;
                }
                else
                {
                    auto curr_value = footer->m_pin_count.load(detail::mem_relaxed);
                    return footer->m_pin_count.compare_exchange_weak(
                      curr_value, curr_value + 1, detail::mem_relaxed);
                }
            }